

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pTVar4;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  value_type local_4c;
  Enum local_44;
  iterator iStack_40;
  Type type;
  iterator __end2;
  iterator __begin2;
  TypeVector *__range2;
  Index func_index_local;
  Location *loc_local;
  SharedValidator *this_local;
  
  this->expr_loc_ = loc;
  std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
  clear(&this->locals_);
  sVar2 = std::
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          ::size(&this->funcs_);
  if (func_index < sVar2) {
    pvVar3 = std::
             vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
             ::operator[](&this->funcs_,(ulong)func_index);
    __end2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&pvVar3->params);
    iStack_40 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&pvVar3->params);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
      if (!bVar1) break;
      pTVar4 = __gnu_cxx::
               __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
               ::operator*(&__end2);
      local_4c.type.enum_ = pTVar4->enum_;
      local_44 = local_4c.type.enum_;
      local_4c.end = GetLocalCount(this);
      local_4c.end = local_4c.end + 1;
      std::
      vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
      push_back(&this->locals_,&local_4c);
      __gnu_cxx::
      __normal_iterator<wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
      operator++(&__end2);
    }
    pvVar3 = std::
             vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
             ::operator[](&this->funcs_,(ulong)func_index);
    this_local._4_4_ = TypeChecker::BeginFunction(&this->typechecker_,&pvVar3->results);
  }
  else {
    memset(&local_68,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_68);
    this_local._4_4_ = TypeChecker::BeginFunction(&this->typechecker_,&local_68);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_68);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = &loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}